

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator.h
# Opt level: O2

void __thiscall Nova::Grid_Iterator<float,_2>::Next_Helper(Grid_Iterator<float,_2> *this)

{
  int iVar1;
  
  iVar1 = (this->index)._data._M_elems[0];
  (this->index)._data._M_elems[1] = (this->region).min_corner._data._M_elems[1];
  if (iVar1 < (this->region).max_corner._data._M_elems[0]) {
    (this->index)._data._M_elems[0] = iVar1 + 1;
    return;
  }
  iVar1 = this->current_region;
  (this->index)._data._M_elems[0] = (this->region).min_corner._data._M_elems[0];
  Reset(this,iVar1 + 1);
  return;
}

Assistant:

void Next_Helper()
    {
        index(d-1)=region.min_corner(d-1);
        for(int i=d-2;i>=0;--i)
        {
            if(index(i)<region.max_corner(i)){++index(i);return;}
            index(i)=region.min_corner(i);
        }
        Reset(current_region+1);
    }